

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSelect.c
# Opt level: O3

int If_ManNodeShapeMap2_rec(If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited,Vec_Int_t *vShape)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  void **ppvVar6;
  float fVar7;
  float fVar8;
  If_Obj_t *pIVar9;
  If_Obj_t *local_58;
  
  fVar7 = (pIfObj->CutBest).Area;
  if (fVar7 == 0.0) {
    uVar3 = vVisited->nSize;
    if (uVar3 == vVisited->nCap) {
      if ((int)uVar3 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar6;
        vVisited->nCap = 0x10;
      }
      else {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar3 << 4);
        }
        vVisited->pArray = ppvVar6;
        vVisited->nCap = uVar3 * 2;
      }
    }
    else {
      ppvVar6 = vVisited->pArray;
    }
    iVar1 = vVisited->nSize;
    vVisited->nSize = iVar1 + 1;
    ppvVar6[iVar1] = &pIfObj->CutBest;
    (pIfObj->CutBest).Area = -NAN;
    fVar7 = -NAN;
    if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x2) {
      fVar7 = 0.0;
      local_58 = (If_Obj_t *)0x0;
      pIVar9 = pIfObj;
      fVar8 = fVar7;
      do {
        uVar3 = If_ManNodeShapeMap2_rec(pIfMan,pIVar9->pFanin0,vVisited,vShape);
        if (uVar3 != 0xffffffff) {
          uVar4 = If_ManNodeShapeMap2_rec(pIfMan,pIVar9->pFanin1,vVisited,vShape);
          if (uVar4 != 0xffffffff) {
            fVar5 = (float)(uVar4 | uVar3);
            if ((int)fVar7 < (int)fVar5) {
              local_58 = pIVar9;
            }
            bVar2 = (int)fVar7 <= (int)fVar5;
            fVar7 = fVar8;
            if (bVar2) {
              fVar7 = fVar5;
              fVar8 = fVar5;
            }
          }
        }
        pIVar9 = pIVar9->pEquiv;
      } while (pIVar9 != (If_Obj_t *)0x0);
      if (local_58 == (If_Obj_t *)0x0) {
        fVar7 = (pIfObj->CutBest).Area;
      }
      else {
        Vec_IntPush(vShape,pIfObj->Id);
        Vec_IntPush(vShape,local_58->Id);
        (pIfObj->CutBest).Area = fVar7;
      }
    }
  }
  return (int)fVar7;
}

Assistant:

int If_ManNodeShapeMap2_rec( If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited, Vec_Int_t * vShape )
{
    If_Cut_t * pCut;
    If_Obj_t * pTemp, * pTempBest = NULL;
    int i, iFunc, iFunc0, iFunc1, iBest = 0;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutDataInt(pCut) )
        return If_CutDataInt(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return If_CutDataInt(pCut);
    // compute the functions of the children
    for ( i = 0, pTemp = pIfObj; pTemp; pTemp = pTemp->pEquiv, i++ )
    {
        iFunc0 = If_ManNodeShapeMap2_rec( pIfMan, pTemp->pFanin0, vVisited, vShape );
        if ( iFunc0 == ~0 )
            continue;
        iFunc1 = If_ManNodeShapeMap2_rec( pIfMan, pTemp->pFanin1, vVisited, vShape );
        if ( iFunc1 == ~0 )
            continue;
        iFunc = iFunc0 | iFunc1;
//        if ( If_WordCountOnes(iBest) <= If_WordCountOnes(iFunc) )
        if ( iBest < iFunc )
        {
            iBest = iFunc;
            pTempBest = pTemp;
        }
    }
    if ( pTempBest )
    {
        Vec_IntPush( vShape, pIfObj->Id );
        Vec_IntPush( vShape, pTempBest->Id );
        If_CutSetDataInt( pCut, iBest );
    }
    return If_CutDataInt(pCut);
}